

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

int64_t __thiscall
icu_63::CollationIterator::nextCEFromCE32
          (CollationIterator *this,CollationData *d,UChar32 c,uint32_t ce32,UErrorCode *errorCode)

{
  int i;
  UBool UVar1;
  UErrorCode *errorCode_local;
  uint32_t ce32_local;
  UChar32 c_local;
  CollationData *d_local;
  CollationIterator *this_local;
  
  (this->ceBuffer).length = (this->ceBuffer).length + -1;
  appendCEsFromCE32(this,d,c,ce32,'\x01',errorCode);
  UVar1 = ::U_SUCCESS(*errorCode);
  if (UVar1 == '\0') {
    this_local = (CollationIterator *)0x1;
  }
  else {
    i = this->cesIndex;
    this->cesIndex = i + 1;
    this_local = (CollationIterator *)CEBuffer::get(&this->ceBuffer,i);
  }
  return (int64_t)this_local;
}

Assistant:

int64_t
CollationIterator::nextCEFromCE32(const CollationData *d, UChar32 c, uint32_t ce32,
                                  UErrorCode &errorCode) {
    --ceBuffer.length;  // Undo ceBuffer.incLength().
    appendCEsFromCE32(d, c, ce32, TRUE, errorCode);
    if(U_SUCCESS(errorCode)) {
        return ceBuffer.get(cesIndex++);
    } else {
        return Collation::NO_CE_PRIMARY;
    }
}